

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O1

ChMatrix33<double> * __thiscall
chrono::fea::ChElementShellANCF_3833::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementShellANCF_3833 *this,double layer,
          double xi,double eta,double layer_zeta)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  pointer pLVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ChKblockGeneric *pCVar26;
  double *pdVar27;
  Index row;
  long lVar28;
  ChElementShellANCF_3833 *this_00;
  ChElementShellANCF_3833 *this_01;
  ActualDstType actualDst;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  double dVar42;
  undefined1 auVar43 [16];
  double dVar45;
  undefined1 auVar44 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  double local_920;
  double dStack_918;
  Scalar local_8c8;
  Matrix<double,_3,_3,_0,_3,_3> local_8c0;
  Matrix<double,_3,_3,_0,_3,_3> local_840;
  undefined1 local_7c0 [584];
  double dStack_578;
  double dStack_570;
  double dStack_568;
  double dStack_560;
  double dStack_558;
  double dStack_550;
  double dStack_548;
  double local_540;
  undefined1 local_500 [16];
  double local_4f0;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0;
  double local_4b8;
  MatrixNx3c *local_4b0;
  Matrix<double,_3,_3,_1,_3,_3> *local_4a8;
  double local_4a0;
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar41._8_56_ = in_register_00001208;
  auVar41._0_8_ = layer;
  lVar28 = vcvttsd2usi_avx512f(auVar41._0_16_);
  dVar42 = (this->m_layers).
           super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar28].m_thickness;
  Calc_Sxi_D(this,(MatrixNx3c *)local_2c0,xi,eta,layer_zeta,dVar42,
             ((this->m_layer_zoffsets).super__Vector_base<double,_Eigen::aligned_allocator<double>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar28] - this->m_thicknessZ * 0.5) +
             dVar42 * 0.5 + this->m_midsurfoffset);
  local_540 = 0.0;
  local_7c0._576_8_ = 0.0;
  dStack_578 = 0.0;
  dStack_570 = 0.0;
  dStack_568 = 0.0;
  dStack_560 = 0.0;
  dStack_558 = 0.0;
  dStack_550 = 0.0;
  dStack_548 = 0.0;
  local_500._0_8_ = 1.0;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)(local_7c0 + 0x240),&this->m_ebar0,
             (MatrixNx3c *)local_2c0,(Scalar *)local_500);
  local_7c0._0_8_ = (MatrixNx3c *)local_2c0;
  local_7c0._8_8_ = (Matrix<double,_3,_3,_1,_3,_3> *)(local_7c0 + 0x240);
  local_500._0_8_ = (MatrixNx3c *)local_2c0;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)(local_500 + 8),(SrcXprType *)(local_7c0 + 8),
        (assign_op<double,_double> *)&local_840);
  local_4b0 = (MatrixNx3c *)local_500._0_8_;
  local_4a0 = 1.48219693752374e-323;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_500._8_8_;
  auVar33 = vbroadcastsd_avx512f(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_4e0;
  auVar34 = vbroadcastsd_avx512f(auVar30);
  auVar41 = *(undefined1 (*) [64])
             (((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array;
  auVar35 = vmulpd_avx512f(auVar41,auVar33);
  auVar1 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 8);
  auVar2 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x10);
  auVar3 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x18);
  auVar4 = *(undefined1 (*) [64])
            ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
             m_storage).m_data.array + 0x20);
  auVar36 = vfmadd231pd_avx512f(auVar35,auVar3,auVar34);
  auVar35 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_4c8;
  auVar37 = vbroadcastsd_avx512f(auVar31);
  local_2c0 = vfmadd231pd_avx512f(auVar36,auVar35,auVar37);
  auVar36 = vmulpd_avx512f(auVar33,auVar1);
  auVar38 = vfmadd231pd_avx512f(auVar36,auVar4,auVar34);
  auVar36 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x38);
  local_280 = vfmadd231pd_avx512f(auVar38,auVar36,auVar37);
  auVar38 = vmulpd_avx512f(auVar33,auVar2);
  auVar33 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x28);
  auVar38 = vfmadd231pd_avx512f(auVar38,auVar33,auVar34);
  auVar34 = *(undefined1 (*) [64])
             ((((PlainObjectBase<Eigen::Matrix<double,_24,_3,_0,_24,_3>_> *)local_500._0_8_)->
              m_storage).m_data.array + 0x40);
  local_240 = vfmadd231pd_avx512f(auVar38,auVar34,auVar37);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_4f0;
  auVar37 = vbroadcastsd_avx512f(auVar32);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_4d8;
  auVar38 = vbroadcastsd_avx512f(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_4c0;
  auVar39 = vbroadcastsd_avx512f(auVar6);
  auVar40 = vmulpd_avx512f(auVar41,auVar37);
  auVar40 = vfmadd231pd_avx512f(auVar40,auVar3,auVar38);
  local_200 = vfmadd231pd_avx512f(auVar40,auVar35,auVar39);
  auVar40 = vmulpd_avx512f(auVar1,auVar37);
  auVar40 = vfmadd231pd_avx512f(auVar40,auVar4,auVar38);
  local_1c0 = vfmadd231pd_avx512f(auVar40,auVar36,auVar39);
  auVar37 = vmulpd_avx512f(auVar2,auVar37);
  auVar37 = vfmadd231pd_avx512f(auVar37,auVar33,auVar38);
  local_180 = vfmadd231pd_avx512f(auVar37,auVar34,auVar39);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_4e8;
  auVar37 = vbroadcastsd_avx512f(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_4d0;
  auVar38 = vbroadcastsd_avx512f(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_4b8;
  auVar39 = vbroadcastsd_avx512f(auVar9);
  auVar41 = vmulpd_avx512f(auVar41,auVar37);
  auVar41 = vfmadd231pd_avx512f(auVar41,auVar38,auVar3);
  local_140 = vfmadd231pd_avx512f(auVar41,auVar39,auVar35);
  auVar41 = vmulpd_avx512f(auVar1,auVar37);
  auVar41 = vfmadd231pd_avx512f(auVar41,auVar38,auVar4);
  local_100 = vfmadd231pd_avx512f(auVar41,auVar39,auVar36);
  auVar41 = vmulpd_avx512f(auVar2,auVar37);
  auVar41 = vfmadd231pd_avx512f(auVar41,auVar33,auVar38);
  local_c0 = vfmadd231pd_avx512f(auVar41,auVar34,auVar39);
  local_4a8 = (Matrix<double,_3,_3,_1,_3,_3> *)(local_500 + 8);
  CalcCoordMatrix(this,(Matrix3xN *)local_500);
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       0.0;
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       0.0;
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_7c0._0_8_ = (_func_int **)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
            (&local_840,(Matrix3xN *)local_500,(MatrixNx3c *)local_2c0,(Scalar *)local_7c0);
  dVar19 = (local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[2] +
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[0] +
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[1] + -1.0) * 0.5;
  dVar20 = (local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[5] +
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[3] +
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[4] + -1.0) * 0.5;
  dVar21 = (local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[8] +
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6] +
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] *
            local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[7] + -1.0) * 0.5;
  dVar42 = local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar45 = local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[8] +
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[6] +
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[7];
  dVar18 = local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] +
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[0] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[3] +
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[1] *
           local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[4];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar18;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = dVar45;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar42;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar21;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar20;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar19;
  if (this->m_damping_enabled == true) {
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_7c0);
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
         = 0.0;
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
         = 0.0;
    local_8c8 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,3,24,1,3,24>,Eigen::Matrix<double,24,3,0,24,3>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,3,3,0,3,3>>
              (&local_8c0,(Matrix3xN *)local_7c0,(Matrix<double,_24,_3,_0,_24,_3> *)local_2c0,
               &local_8c8);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = this->m_Alpha;
    auVar23._8_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar23._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar22._8_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
    auVar22._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
    auVar29 = vmulpd_avx512vl(auVar23,auVar22);
    auVar53._8_8_ = 0;
    auVar53._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar30 = vmulsd_avx512f(auVar53,auVar63);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar19;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auVar29._0_8_ + auVar29._8_8_ + auVar30._0_8_;
    auVar29 = vfmadd213sd_fma(auVar52,auVar43,auVar10);
    auVar24._8_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar24._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
    auVar57._8_8_ = 0;
    auVar57._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar20;
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
    auVar30 = vfmadd213sd_fma(auVar56,auVar43,auVar11);
    auVar25._8_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar25._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
    auVar60._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar60._8_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
    auVar61._8_8_ = 0;
    auVar61._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar62._8_8_ = 0;
    auVar62._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
    auVar31 = vmulsd_avx512f(auVar61,auVar62);
    auVar31 = vaddsd_avx512f(auVar60,auVar31);
    auVar48._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar48._8_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
    auVar32 = vmulsd_avx512f(auVar57,auVar62);
    auVar32 = vaddsd_avx512f(auVar48,auVar32);
    local_930 = vunpcklpd_avx(auVar29,auVar30);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar21;
    auVar29 = vfmadd213sd_fma(auVar31,auVar43,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = dVar42;
    auVar49._8_8_ = 0;
    auVar49._0_8_ =
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] + auVar32._0_8_;
    auVar30 = vfmadd213sd_fma(auVar49,auVar43,auVar13);
    local_940 = vunpcklpd_avx(auVar29,auVar30);
    auVar29 = vmulpd_avx512vl(auVar22,auVar25);
    auVar30 = vmulsd_avx512f(auVar63,auVar61);
    auVar31 = vmulpd_avx512vl(auVar22,auVar24);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = dVar45;
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         auVar29._0_8_ + auVar29._8_8_ + auVar30._0_8_ +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar29 = vfmadd213sd_fma(auVar50,auVar43,auVar14);
    auVar64._8_8_ = 0;
    auVar64._0_8_ =
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar30 = vmulsd_avx512f(auVar64,auVar57);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = dVar18;
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         auVar31._0_8_ + auVar31._8_8_ + auVar30._0_8_ +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3] +
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1] *
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4] +
         local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5] *
         local_840.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
    auVar30 = vfmadd213sd_fma(auVar47,auVar43,auVar15);
    auVar29 = vunpcklpd_avx(auVar29,auVar30);
  }
  else {
    local_930 = vunpcklpd_avx(auVar59,auVar58);
    local_940 = vunpcklpd_avx(auVar55,auVar54);
    auVar29 = vunpcklpd_avx(auVar51,auVar46);
  }
  pLVar16 = (this->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = (long)pLVar16[lVar28].m_material.
                 super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
  this_01 = (ChElementShellANCF_3833 *)
            pLVar16[lVar28].m_material.
            super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 == (ChElementShellANCF_3833 *)0x0) {
    this_00 = (ChElementShellANCF_3833 *)local_7c0;
    memcpy(this_00,(void *)(lVar17 + 0x20),0x120);
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      pCVar26 = (ChKblockGeneric *)
                ((long)&(this_01->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar26->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar26->super_ChKblock)._vptr_ChKblock + 1;
      UNLOCK();
    }
    else {
      pCVar26 = (ChKblockGeneric *)
                ((long)&(this_01->super_ChElementShell).super_ChElementGeneric + 8);
      *(int *)&(pCVar26->super_ChKblock)._vptr_ChKblock =
           *(int *)&(pCVar26->super_ChKblock)._vptr_ChKblock + 1;
    }
    this_00 = (ChElementShellANCF_3833 *)local_7c0;
    memcpy(this_00,(void *)(lVar17 + 0x20),0x120);
    if (this_01 != (ChElementShellANCF_3833 *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
      this_00 = this_01;
    }
  }
  RotateReorderStiffnessMatrix
            (this_00,(ChMatrixNM<double,_6,_6> *)local_7c0,
             (this->m_layers).
             super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar28].m_theta);
  pdVar27 = (double *)(local_7c0 + 0x20);
  lVar28 = 0;
  local_920 = auVar29._0_8_;
  dStack_918 = auVar29._8_8_;
  do {
    dVar42 = (double)local_930._0_8_ * pdVar27[-4] +
             (double)local_940._0_8_ * pdVar27[-2] + local_920 * *pdVar27;
    dVar45 = (double)local_930._8_8_ * pdVar27[-3] +
             (double)local_940._8_8_ * pdVar27[-1] + dStack_918 * pdVar27[1];
    auVar44._0_8_ = dVar42 + dVar45;
    auVar44._8_8_ = dVar42 + dVar45;
    dVar42 = (double)vmovlpd_avx(auVar44);
    local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [lVar28] = dVar42;
    lVar28 = lVar28 + 1;
    pdVar27 = pdVar27 + 6;
  } while (lVar28 != 6);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_8c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> ChElementShellANCF_3833::GetPK2Stress(const double layer,
                                                   const double xi,
                                                   const double eta,
                                                   const double layer_zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    double layer_midsurface_offset =
        -m_thicknessZ / 2 + m_layer_zoffsets[layer] + m_layers[layer].Get_thickness() / 2 + m_midsurfoffset;
    Calc_Sxi_D(Sxi_D, xi, eta, layer_zeta, m_layers[layer].Get_thickness(), layer_midsurface_offset);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
    // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
    // this element compared to what is used in ChMaterialShellANCF

    ChMatrixNM<double, 6, 6> D = m_layers[layer].GetMaterial()->Get_E_eps();
    RotateReorderStiffnessMatrix(D, m_layers[layer].Get_theta());

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}